

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree_test.cpp
# Opt level: O3

Naive * __thiscall Naive::rangeUpdate(Naive *this,int fr,int to,ll x)

{
  long *plVar1;
  pointer plVar2;
  vector<long_long,_std::allocator<long_long>_> *this_00;
  long lVar3;
  allocator_type local_31;
  
  this_00 = (vector<long_long,_std::allocator<long_long>_> *)operator_new(0x18);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (this_00,(long)(int)((ulong)((long)(this->vals).
                                               super__Vector_base<long_long,_std::allocator<long_long>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->vals).
                                              super__Vector_base<long_long,_std::allocator<long_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3),
             &local_31);
  std::vector<long_long,_std::allocator<long_long>_>::operator=(this_00,&this->vals);
  if (fr < to) {
    plVar2 = (this_00->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)fr;
    do {
      plVar1 = plVar2 + lVar3;
      *plVar1 = *plVar1 + x;
      lVar3 = lVar3 + 1;
    } while (to != lVar3);
  }
  return (Naive *)this_00;
}

Assistant:

Naive* rangeUpdate(int fr, int to, ll x) const {
        auto res = new Naive(vals.size());
        res->vals = vals;
        rep(i, fr, to) {
            res->vals[i] += x;
        }
        return res;
    }